

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

PersistentColumnData *
duckdb::PersistentColumnData::Deserialize
          (PersistentColumnData *__return_storage_ptr__,Deserializer *deserializer)

{
  PhysicalType physical_type_p;
  int iVar1;
  LogicalType *pLVar2;
  child_list_t<LogicalType> *this;
  undefined4 extraout_var;
  const_reference pvVar3;
  size_type __n;
  type local_70;
  
  pLVar2 = SerializationData::Get<duckdb::LogicalType_const&>(&deserializer->data);
  physical_type_p = pLVar2->physical_type_;
  PersistentColumnData(__return_storage_ptr__,physical_type_p);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::DataPointer,true>>
            (deserializer,100,"data_pointers",&__return_storage_ptr__->pointers);
  if (__return_storage_ptr__->physical_type == BIT) {
    return __return_storage_ptr__;
  }
  LogicalType::LogicalType((LogicalType *)&local_70,VALIDITY);
  DeserializeField(__return_storage_ptr__,deserializer,0x65,"validity",(LogicalType *)&local_70);
  LogicalType::~LogicalType((LogicalType *)&local_70);
  if (physical_type_p == LIST) {
    pLVar2 = ListType::GetChildType(pLVar2);
  }
  else {
    if (physical_type_p == STRUCT) {
      this = StructType::GetChildTypes_abi_cxx11_(pLVar2);
      (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"sub_columns");
      iVar1 = (*deserializer->_vptr_Deserializer[8])(deserializer);
      for (__n = 0; CONCAT44(extraout_var,iVar1) != __n; __n = __n + 1) {
        pvVar3 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                 ::get<true>(this,__n);
        ::std::
        deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
        ::emplace_back<duckdb::LogicalType_const&>
                  ((deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
                    *)&(deserializer->data).types,&pvVar3->second);
        Deserializer::Read<duckdb::PersistentColumnData>(&local_70,deserializer);
        ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
        emplace_back<duckdb::PersistentColumnData>
                  (&(__return_storage_ptr__->child_columns).
                    super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                   ,&local_70);
        ~PersistentColumnData(&local_70);
        SerializationData::Unset<duckdb::LogicalType>(&deserializer->data);
      }
      (*deserializer->_vptr_Deserializer[9])(deserializer);
      (*deserializer->_vptr_Deserializer[3])(deserializer);
      return __return_storage_ptr__;
    }
    if (physical_type_p != ARRAY) {
      return __return_storage_ptr__;
    }
    pLVar2 = ArrayType::GetChildType(pLVar2);
  }
  DeserializeField(__return_storage_ptr__,deserializer,0x66,"child_column",pLVar2);
  return __return_storage_ptr__;
}

Assistant:

PersistentColumnData PersistentColumnData::Deserialize(Deserializer &deserializer) {
	auto &type = deserializer.Get<const LogicalType &>();
	auto physical_type = type.InternalType();
	PersistentColumnData result(physical_type);
	deserializer.ReadPropertyWithDefault(100, "data_pointers", static_cast<vector<DataPointer> &>(result.pointers));
	if (result.physical_type == PhysicalType::BIT) {
		// validity: return
		return result;
	}
	result.DeserializeField(deserializer, 101, "validity", LogicalTypeId::VALIDITY);
	switch (physical_type) {
	case PhysicalType::ARRAY:
		result.DeserializeField(deserializer, 102, "child_column", ArrayType::GetChildType(type));
		break;
	case PhysicalType::LIST:
		result.DeserializeField(deserializer, 102, "child_column", ListType::GetChildType(type));
		break;
	case PhysicalType::STRUCT: {
		auto &child_types = StructType::GetChildTypes(type);
		deserializer.ReadList(102, "sub_columns", [&](Deserializer::List &list, idx_t i) {
			deserializer.Set<const LogicalType &>(child_types[i].second);
			result.child_columns.push_back(list.ReadElement<PersistentColumnData>());
			deserializer.Unset<LogicalType>();
		});
		break;
	}
	default:
		break;
	}
	return result;
}